

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,SocketFactory *sf,io_context *io_context,string *address,string *port,
          bool port_reuse,int nominalBufferSize)

{
  pointer pbVar1;
  undefined8 *puVar2;
  pointer pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 local_148 [32];
  basic_resolver_iterator<asio::ip::tcp> local_128;
  iterator end;
  resolver resolver;
  query query;
  
  (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ioctx = io_context;
  (this->socket_factory).super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this
  .super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->socket_factory).super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this
  .super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar6 = sf->handshake_server;
  (this->socket_factory).encrypted = sf->encrypted;
  (this->socket_factory).handshake_server = bVar6;
  (this->accepting).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->accepting).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->accepting).super___mutex_base._M_mutex + 0x10) = 0;
  (this->accepting).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->accepting).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bufferSize = (long)nominalBufferSize;
  *(undefined8 *)&(this->dataCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->dataCall).super__Function_base._M_functor + 8) = 0;
  (this->dataCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->dataCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->errorCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->errorCall).super__Function_base._M_functor + 8) = 0;
  (this->errorCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->errorCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->logFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->logFunction).super__Function_base._M_functor + 8) = 0;
  (this->logFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->logFunction)._M_invoker = (_Invoker_type)0x0;
  (this->halted)._M_base._M_i = false;
  this->reuse_address = port_reuse;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            (&resolver,io_context,0);
  local_148._0_4_ = 2;
  ::asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&query,(protocol_type *)local_148,address,port,canonical_name);
  ::asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)local_148,&resolver,&query);
  local_128.index_ = CONCAT44(local_148._20_4_,local_148._16_4_);
  local_148._8_4_ = 0;
  local_148._12_4_ = 0;
  local_148._16_4_ = 0;
  local_148._20_4_ = 0;
  local_128.values_.
  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_148._0_8_;
  local_148._0_8_ = (element_type *)0x0;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  end.values_.
  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  end.values_.
  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  end.index_ = 0;
  bVar6 = ::asio::ip::operator!=(&local_128,&end);
  if (bVar6) {
    while( true ) {
      bVar6 = ::asio::ip::operator!=(&local_128,&end);
      if (!bVar6) break;
      pbVar3 = ((local_128.values_.
                 super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->
               super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = pbVar3 + local_128.index_;
      local_148._0_8_ = *(undefined8 *)&(pbVar1->endpoint_).impl_.data_;
      puVar2 = (undefined8 *)((long)&pbVar3[local_128.index_].endpoint_.impl_.data_ + 0xc);
      uVar4 = *puVar2;
      uVar5 = puVar2[1];
      local_148._8_4_ = (undefined4)*(undefined8 *)((long)&(pbVar1->endpoint_).impl_.data_ + 8);
      local_148._12_4_ = (undefined4)uVar4;
      local_148._16_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      local_148._20_4_ = (undefined4)uVar5;
      local_148._24_4_ = (undefined4)((ulong)uVar5 >> 0x20);
      std::
      vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
      ::emplace_back<asio::ip::basic_endpoint<asio::ip::tcp>>
                ((vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
                  *)&this->endpoints,(basic_endpoint<asio::ip::tcp> *)local_148);
      ::asio::ip::basic_resolver_iterator<asio::ip::tcp>::increment(&local_128);
    }
    initialConnect(this);
  }
  else {
    LOCK();
    (this->halted)._M_base._M_i = true;
    UNLOCK();
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &end.values_.
              super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_128.values_.
              super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ::asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&query);
  ::asio::detail::
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&resolver.impl_);
  return;
}

Assistant:

TcpServer::TcpServer(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& address,
    const std::string& port,
    bool port_reuse,
    int nominalBufferSize) :
    ioctx(io_context), socket_factory(sf), bufferSize(nominalBufferSize),
    reuse_address(port_reuse)
{
    tcp::resolver resolver(io_context);
    tcp::resolver::query query(
        tcp::v4(), address, port, tcp::resolver::query::canonical_name);
    tcp::resolver::iterator endpoint_iterator = resolver.resolve(query);
    tcp::resolver::iterator end;
    if (endpoint_iterator != end) {
        while (endpoint_iterator != end) {
            endpoints.push_back(*endpoint_iterator);
            ++endpoint_iterator;
        }
    } else {
        halted = true;
        return;
    }
    initialConnect();
}